

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crash.c
# Opt level: O3

void test_pool(void)

{
  tp_task_t *ptVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  undefined1 local_130 [8];
  thread_pool_t tp;
  tp_task_t *tasks [10];
  
  cVar2 = tp_init(local_130,0x14);
  if (cVar2 == '\0') {
    __assert_fail("tp_init(&tp, 20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_crash.c"
                  ,0x29,"void test_pool()");
  }
  cVar2 = tp_start(local_130);
  if (cVar2 != '\0') {
    lVar4 = 0;
    do {
      ptVar1 = (tp_task_t *)tp_task_create(task1,cleanup1,0,0);
      tasks[lVar4 + -1] = ptVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    iVar3 = tp_post_tasks(local_130,(undefined1 *)((long)&tp.no_task + 0x28),10);
    if (iVar3 == 10) {
      tp_join_tasks(local_130);
      tp_destroy(local_130);
      return;
    }
    __assert_fail("LEN == tp_post_tasks(&tp, tasks, LEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_crash.c"
                  ,0x31,"void test_pool()");
  }
  __assert_fail("tp_start(&tp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_crash.c"
                ,0x2a,"void test_pool()");
}

Assistant:

void test_pool()
{
    int i;
    int a[LEN];
    thread_pool_t tp;
    tp_task_t *tasks[LEN];

    bzero(a, sizeof(int) * LEN);

    assert(tp_init(&tp, 20));
    assert(tp_start(&tp));


    for (i = 0; i < LEN; ++i) {
        tasks[i] = tp_task_create(task1, cleanup1, NULL, 0);
    }

    assert(LEN == tp_post_tasks(&tp, tasks, LEN));

    tp_join_tasks(&tp);
    tp_destroy(&tp);
}